

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDErrorReporter.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XSDErrorReporter::emitError
          (XSDErrorReporter *this,uint toEmit,XMLCh *msgDomain,Locator *aLocator,XMLCh *text1,
          XMLCh *text2,XMLCh *text3,XMLCh *text4,MemoryManager *manager)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLErrorReporter *pXVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint *puVar8;
  XMLCh *pXVar9;
  long *plVar10;
  XMLCh *pXVar11;
  uint uVar12;
  XMLCh errText [2048];
  
  uVar12 = 0;
  if ((10 < toEmit - 1) && (uVar12 = 2, 0x84 < toEmit - 0x9b)) {
    uVar12 = (uint)(0x8e < toEmit - 0xc) * 2 + 1;
  }
  if (msgDomain != L"http://apache.org/xml/messages/XMLValidity") {
    plVar10 = gErrMsgLoader;
    if (msgDomain != (XMLCh *)0x0) {
      pXVar9 = msgDomain;
      pXVar11 = L"http://apache.org/xml/messages/XMLValidity";
      do {
        XVar1 = *pXVar9;
        if (XVar1 == L'\0') goto LAB_0033a7cc;
        pXVar9 = pXVar9 + 1;
        XVar2 = *pXVar11;
        pXVar11 = pXVar11 + 1;
      } while (XVar1 == XVar2);
      goto LAB_0033a809;
    }
    pXVar11 = L"http://apache.org/xml/messages/XMLValidity";
LAB_0033a7cc:
    if (*pXVar11 != L'\0') goto LAB_0033a809;
  }
  plVar10 = gValidMsgLoader;
  if ((toEmit & 0xfffffffe) == 0x50) {
    uVar12 = 0;
  }
  else if ((toEmit & 0xfffffffe) == 0x52) {
    uVar12 = 2;
  }
  else {
    uVar12 = (uint)(0x4e < toEmit - 1) * 2 + 1;
  }
LAB_0033a809:
  (**(code **)(*plVar10 + 0x18))(plVar10,toEmit,errText,0x7ff,text1,text2,text3,text4,manager);
  pXVar3 = this->fErrorReporter;
  if (pXVar3 != (XMLErrorReporter *)0x0) {
    iVar4 = (*aLocator->_vptr_Locator[3])(aLocator);
    iVar5 = (*aLocator->_vptr_Locator[2])(aLocator);
    iVar6 = (*aLocator->_vptr_Locator[4])(aLocator);
    iVar7 = (*aLocator->_vptr_Locator[5])(aLocator);
    (*pXVar3->_vptr_XMLErrorReporter[2])
              (pXVar3,(ulong)toEmit,msgDomain,(ulong)uVar12,errText,CONCAT44(extraout_var,iVar4),
               CONCAT44(extraout_var_00,iVar5),CONCAT44(extraout_var_01,iVar6),
               CONCAT44(extraout_var_02,iVar7));
  }
  if ((uVar12 == 2) && (this->fExitOnFirstFatal == true)) {
    puVar8 = (uint *)__cxa_allocate_exception(4);
    *puVar8 = toEmit;
    __cxa_throw(puVar8,&XMLErrs::Codes::typeinfo,0);
  }
  return;
}

Assistant:

void XSDErrorReporter::emitError(const unsigned int toEmit,
                                 const XMLCh* const msgDomain,
                                 const Locator* const aLocator,
                                 const XMLCh* const text1,
                                 const XMLCh* const text2,
                                 const XMLCh* const text3,
                                 const XMLCh* const text4,
                                 MemoryManager* const manager)
{
    // Bump the error count if it is not a warning
//    if (XMLErrs::errorType(toEmit) != XMLErrorReporter::ErrType_Warning)
//        incrementErrorCount();

    //
    //  Load the message into alocal and replace any tokens found in
    //  the text.
    //
    const XMLSize_t maxChars = 2047;
    XMLCh errText[maxChars + 1];
    XMLMsgLoader* msgLoader = gErrMsgLoader;
    XMLErrorReporter::ErrTypes errType = XMLErrs::errorType((XMLErrs::Codes) toEmit);

    if (XMLString::equals(msgDomain, XMLUni::fgValidityDomain)) {

        errType = XMLValid::errorType((XMLValid::Codes) toEmit);
        msgLoader = gValidMsgLoader;
    }

    if (!msgLoader->loadMsg(toEmit, errText, maxChars, text1, text2, text3, text4, manager))
    {
                // <TBD> Should probably load a default message here
    }

    if (fErrorReporter)
        fErrorReporter->error(toEmit, msgDomain, errType, errText, aLocator->getSystemId(),
                              aLocator->getPublicId(), aLocator->getLineNumber(),
                              aLocator->getColumnNumber());

    // Bail out if its fatal an we are to give up on the first fatal error
    if (errType == XMLErrorReporter::ErrType_Fatal && fExitOnFirstFatal)
        throw (XMLErrs::Codes) toEmit;
}